

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void opengv::relative_pose::modules::ge_main
               (Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,Matrix3d *yzF,Matrix3d *zxF,
               Matrix<double,_3,_9,_0,_3,_9> *x1P,Matrix<double,_3,_9,_0,_3,_9> *y1P,
               Matrix<double,_3,_9,_0,_3,_9> *z1P,Matrix<double,_3,_9,_0,_3,_9> *x2P,
               Matrix<double,_3,_9,_0,_3,_9> *y2P,Matrix<double,_3,_9,_0,_3,_9> *z2P,
               Matrix<double,_9,_9,_0,_9,_9> *m11P,Matrix<double,_9,_9,_0,_9,_9> *m12P,
               Matrix<double,_9,_9,_0,_9,_9> *m22P,cayley_t *startingPoint,geOutput_t *output)

{
  Scalar *this;
  Scalar *pSVar1;
  Scalar *this_00;
  Scalar *pSVar2;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_R9;
  Real RVar3;
  double dVar4;
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0>,_double>
  *in_stack_00000008;
  Vector4d t;
  double factor;
  size_t j;
  size_t i;
  Matrix4d V;
  Vector4d D;
  Matrix<std::complex<double>,_4,_4,_0,_4,_4> V_complex;
  Matrix<std::complex<double>,_4,_1,_0,_4,_1> D_complex;
  EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> Eig;
  Matrix4d G;
  rotation_t R;
  cayley_t cayley;
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0>,_double>
  lm;
  NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0> numDiff;
  Ge_step functor;
  VectorXd x;
  int n;
  Matrix3d *in_stack_000018c0;
  Matrix3d *in_stack_000018c8;
  Matrix3d *in_stack_000018d0;
  Matrix3d *in_stack_000018d8;
  Matrix3d *in_stack_000018e0;
  Matrix3d *in_stack_000018f8;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00001900;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00001908;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00001910;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00001918;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00001920;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00001928;
  Matrix<double,_9,_9,_0,_9,_9> *in_stack_00001930;
  Matrix<double,_9,_9,_0,_9,_9> *in_stack_00001938;
  Matrix<double,_9,_9,_0,_9,_9> *in_stack_00001940;
  cayley_t *in_stack_00001948;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff3c0;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pEVar5;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_fffffffffffff3c8;
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0>,_double>
  *pLVar6;
  int *in_stack_fffffffffffff3d0;
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0>,_double>
  *this_01;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_fffffffffffff3d8;
  NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0> *this_02;
  NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0>
  *in_stack_fffffffffffff410;
  double *scalar;
  undefined7 in_stack_fffffffffffff418;
  undefined1 in_stack_fffffffffffff41f;
  EigenBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *in_stack_fffffffffffff420;
  EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *in_stack_fffffffffffff428;
  Matrix<double,_9,_9,_0,_9,_9> *in_stack_fffffffffffff430;
  Matrix<double,_9,_9,_0,_9,_9> *in_stack_fffffffffffff438;
  Matrix<double,_9,_9,_0,_9,_9> *in_stack_fffffffffffff440;
  cayley_t *in_stack_fffffffffffff4f0;
  EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *in_stack_fffffffffffff560;
  ulong local_a90;
  ulong local_a88;
  EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_880;
  double local_368 [4];
  undefined8 local_348;
  undefined8 local_340;
  double local_338;
  undefined4 local_ac;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_a8;
  
  local_ac = 3;
  local_a8 = in_R9;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            (in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=(in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0);
  pEVar5 = local_a8;
  pLVar6 = in_stack_00000008;
  this_01 = (LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0>,_double>
             *)x1P;
  this_02 = (NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0> *)
            y1P;
  Ge_step::Ge_step((Ge_step *)x2P,(Matrix3d *)z1P,(Matrix3d *)y1P,(Matrix3d *)x1P,
                   (Matrix3d *)in_stack_00000008,(Matrix3d *)local_a8,(Matrix3d *)z2P,
                   (Matrix<double,_3,_9,_0,_3,_9> *)m11P,(Matrix<double,_3,_9,_0,_3,_9> *)m12P,
                   (Matrix<double,_3,_9,_0,_3,_9> *)in_stack_fffffffffffff410,
                   (Matrix<double,_3,_9,_0,_3,_9> *)
                   CONCAT17(in_stack_fffffffffffff41f,in_stack_fffffffffffff418),
                   (Matrix<double,_3,_9,_0,_3,_9> *)in_stack_fffffffffffff420,
                   (Matrix<double,_3,_9,_0,_3,_9> *)in_stack_fffffffffffff428,
                   in_stack_fffffffffffff430,in_stack_fffffffffffff438,in_stack_fffffffffffff440);
  Eigen::NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0>::
  NumericalDiff(this_02,(Functor *)this_01,(Scalar)pLVar6);
  Eigen::
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0>,_double>
  ::LevenbergMarquardt
            ((LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0>,_double>
              *)CONCAT17(in_stack_fffffffffffff41f,in_stack_fffffffffffff418),
             in_stack_fffffffffffff410);
  Eigen::
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0>,_double>
  ::resetParameters((LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0>,_double>
                     *)z2P);
  local_340 = 0x3eb0c6f7a0b5ed8d;
  RVar3 = Eigen::GenericNumTraits<double>::epsilon();
  local_338 = RVar3 * 10.0;
  local_348 = 100;
  Eigen::
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0>,_double>
  ::minimize(this_01,(FVectorType *)pLVar6);
  Eigen::Matrix<double,3,1,0,3,1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)pLVar6,pEVar5);
  math::cayley2rot(in_stack_fffffffffffff4f0);
  scalar = local_368;
  ge::composeG(in_stack_000018e0,in_stack_000018d8,in_stack_000018d0,in_stack_000018c8,
               in_stack_000018c0,in_stack_000018f8,in_stack_00001900,in_stack_00001908,
               in_stack_00001910,in_stack_00001918,in_stack_00001920,in_stack_00001928,
               in_stack_00001930,in_stack_00001938,in_stack_00001940,in_stack_00001948);
  Eigen::EigenSolver<Eigen::Matrix<double,4,4,0,4,4>>::EigenSolver<Eigen::Matrix<double,4,4,0,4,4>>
            (in_stack_fffffffffffff428,in_stack_fffffffffffff420,(bool)in_stack_fffffffffffff41f);
  Eigen::EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::eigenvalues(&local_880);
  Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>::Matrix
            ((Matrix<std::complex<double>,_4,_1,_0,_4,_1> *)in_stack_00000008,
             (Matrix<std::complex<double>,_4,_1,_0,_4,_1> *)local_a8);
  Eigen::EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::eigenvectors(in_stack_fffffffffffff560)
  ;
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0xdaab35);
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)0xdaab44);
  pEVar5 = local_a8;
  pLVar6 = in_stack_00000008;
  for (local_a88 = 0; local_a88 < 4; local_a88 = local_a88 + 1) {
    this = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1> *)
                      pLVar6,(Index)pEVar5);
    dVar4 = std::complex<double>::real_abi_cxx11_(this);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)pLVar6,
                        (Index)pEVar5);
    *pSVar1 = dVar4;
    for (local_a90 = 0; local_a90 < 4; local_a90 = local_a90 + 1) {
      this_00 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_4,_0,_4,_4>,_1>::
                operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_4,_0,_4,_4>,_1> *
                           )pLVar6,(Index)pEVar5,0xdaac04);
      dVar4 = std::complex<double>::real_abi_cxx11_(this_00);
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)pLVar6,
                          (Index)pEVar5,0xdaac43);
      *pSVar2 = dVar4;
    }
  }
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)pLVar6,(Index)pEVar5,
             0xdaace5);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::col
            ((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)y1P,(Index)x1P);
  Eigen::operator*(scalar,(StorageBaseType *)m12P);
  Eigen::Matrix<double,4,1,0,4,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>const>>
            ((Matrix<double,_4,_1,_0,_4,_1> *)pLVar6,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_>_>
              *)pEVar5);
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
            ((Matrix<double,_4,_1,_0,_4,_1> *)pLVar6,(Matrix<double,_4,_1,_0,_4,_1> *)pEVar5);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
            ((Matrix<double,_3,_3,_0,_3,_3> *)pLVar6,(Matrix<double,_3,_3,_0,_3,_3> *)pEVar5);
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
            ((Matrix<double,_4,_1,_0,_4,_1> *)pLVar6,(Matrix<double,_4,_1,_0,_4,_1> *)pEVar5);
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::operator=
            ((Matrix<double,_4,_4,_0,_4,_4> *)pLVar6,(Matrix<double,_4,_4,_0,_4,_4> *)pEVar5);
  Eigen::
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::Ge_step,_(Eigen::NumericalDiffMode)0>,_double>
  ::~LevenbergMarquardt(pLVar6);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0xdaade2);
  return;
}

Assistant:

void
opengv::relative_pose::modules::ge_main(
    const Eigen::Matrix3d & xxF,
    const Eigen::Matrix3d & yyF,
    const Eigen::Matrix3d & zzF,
    const Eigen::Matrix3d & xyF,
    const Eigen::Matrix3d & yzF,
    const Eigen::Matrix3d & zxF,
    const Eigen::Matrix<double,3,9> & x1P,
    const Eigen::Matrix<double,3,9> & y1P,
    const Eigen::Matrix<double,3,9> & z1P,
    const Eigen::Matrix<double,3,9> & x2P,
    const Eigen::Matrix<double,3,9> & y2P,
    const Eigen::Matrix<double,3,9> & z2P,
    const Eigen::Matrix<double,9,9> & m11P,
    const Eigen::Matrix<double,9,9> & m12P,
    const Eigen::Matrix<double,9,9> & m22P,
    const cayley_t & startingPoint,
    geOutput_t & output )
{
  //this one doesn't work, probably because of double numerical differentiation
  //use ge_main2, which is an implementation of gradient descent
  const int n=3;
  VectorXd x(n);

  x = startingPoint;
  Ge_step functor(xxF,yyF,zzF,xyF,yzF,zxF,
      x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P);
  NumericalDiff<Ge_step> numDiff(functor);
  LevenbergMarquardt< NumericalDiff<Ge_step> > lm(numDiff);

  lm.resetParameters();
  lm.parameters.ftol = 0.000001;//1.E1*NumTraits<double>::epsilon();
  lm.parameters.xtol = 1.E1*NumTraits<double>::epsilon();
  lm.parameters.maxfev = 100;
  lm.minimize(x);

  cayley_t cayley = x;
  rotation_t R = math::cayley2rot(cayley);
  
  Eigen::Matrix4d G = ge::composeG(xxF,yyF,zzF,xyF,yzF,zxF,
      x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley);
  
  Eigen::EigenSolver< Eigen::Matrix4d > Eig(G,true);
  Eigen::Matrix<std::complex<double>,4,1> D_complex = Eig.eigenvalues();
  Eigen::Matrix<std::complex<double>,4,4> V_complex = Eig.eigenvectors();
  Eigen::Vector4d D;
  Eigen::Matrix4d V;
  for(size_t i = 0; i < 4; i++)
  {
    D[i] = D_complex[i].real();
    for(size_t j = 0; j < 4; j++)
      V(i,j) = V_complex(i,j).real();
  }

  double factor = V(3,0);
  Eigen::Vector4d t = (1.0/factor) * V.col(0);

  output.translation = t;
  output.rotation = R;
  output.eigenvalues = D;
  output.eigenvectors = V;
}